

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmsio.c
# Opt level: O3

int FmsIOAddIntArray(FmsIOContext *ctx,char *path,FmsInt *values,FmsInt n)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  bool bVar5;
  
  if (ctx == (FmsIOContext *)0x0) {
    iVar3 = 1;
  }
  else if (path == (char *)0x0) {
    iVar3 = 2;
  }
  else {
    iVar3 = 0;
    fprintf((FILE *)ctx->fp,"%s/Size: %lu\n",path);
    fprintf((FILE *)ctx->fp,"%s/Type: %s\n",path,"FMS_UINT64");
    if (n != 0) {
      fprintf((FILE *)ctx->fp,"%s/Values: [",path);
      uVar4 = 0;
      uVar1 = 0;
      do {
        do {
          uVar2 = uVar1;
          fprintf((FILE *)ctx->fp,"%lu",values[uVar2]);
          if (uVar2 < n - 1) {
            fwrite(", ",2,1,(FILE *)ctx->fp);
          }
          bVar5 = uVar4 < 2;
          uVar4 = uVar4 + 1;
          uVar1 = uVar2 + 1;
        } while (bVar5 && uVar1 < n);
        if (uVar1 < n - 1) {
          fputc(10,(FILE *)ctx->fp);
        }
        uVar4 = 0;
        uVar1 = uVar2 + 2;
      } while (uVar2 + 2 < n);
      fwrite("]\n",2,1,(FILE *)ctx->fp);
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

static int
FmsIOAddIntArray(FmsIOContext *ctx, const char *path, const FmsInt *values,
                 FmsInt n) {
  FmsInt i, j;
  if(!ctx) E_RETURN(1);
  if(!path) E_RETURN(2);
  fprintf(ctx->fp, "%s/Size: " FMS_LU "\n", path, n);
  fprintf(ctx->fp, "%s/Type: %s\n", path, FmsIntTypeNames[FMS_UINT64]);

  if(n) {
    /* Should we make it YAML-like?*/
    fprintf(ctx->fp, "%s/Values: [", path);
    for(i = 0; i < n; ++i) {
      for(j = 0; j < FMS_ELE_PER_LINE && i < n; j++, i++) {
        fprintf(ctx->fp, FMS_LU, values[i]);
        if(i < n-1)
          fprintf(ctx->fp, ", ");
      }
      if(i < n-1)
        fprintf(ctx->fp, "\n");
    }
    fprintf(ctx->fp, "]\n");
  }
  return 0;
}